

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O0

bool chibi_filesystem::write_if_different(char *text,char *filename)

{
  FILE *pFVar1;
  FILE *pFVar2;
  __ssize_t _Var3;
  int __fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  FileHandle local_88;
  FileHandle file;
  ssize_t r;
  size_t line_size;
  char *line;
  string existing_text;
  bool local_29;
  bool is_equal;
  FileHandle existing_file;
  char *filename_local;
  char *text_local;
  
  existing_file.f = (FILE *)filename;
  FileHandle::FileHandle((FileHandle *)&stack0xffffffffffffffd8,filename,"rt");
  local_29 = false;
  pFVar1 = FileHandle::operator_cast_to__IO_FILE_((FileHandle *)&stack0xffffffffffffffd8);
  if (pFVar1 != (FILE *)0x0) {
    std::__cxx11::string::string((string *)&line);
    line_size = 0;
    r = 0;
    while( true ) {
      pFVar2 = (FILE *)FileHandle::operator_cast_to__IO_FILE_
                                 ((FileHandle *)&stack0xffffffffffffffd8);
      _Var3 = getline((char **)&line_size,(size_t *)&r,pFVar2);
      if (_Var3 < 0) break;
      std::__cxx11::string::append((char *)&line);
    }
    free((void *)line_size);
    line_size = 0;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line;
    local_29 = std::operator==(text,__rhs);
    FileHandle::close((FileHandle *)&stack0xffffffffffffffd8,(int)__rhs);
    std::__cxx11::string::~string((string *)&line);
  }
  if (local_29 == false) {
    FileHandle::FileHandle(&local_88,(char *)existing_file.f,"wt");
    pFVar1 = FileHandle::operator_cast_to__IO_FILE_(&local_88);
    text_local._7_1_ = pFVar1 != (FILE *)0x0;
    if (text_local._7_1_) {
      pFVar2 = (FILE *)FileHandle::operator_cast_to__IO_FILE_(&local_88);
      __fd = 0x14d776;
      fprintf(pFVar2,"%s",text);
      FileHandle::close(&local_88,__fd);
    }
    file.f._4_4_ = 1;
    FileHandle::~FileHandle(&local_88);
  }
  else {
    text_local._7_1_ = true;
    file.f._4_4_ = 1;
  }
  FileHandle::~FileHandle((FileHandle *)&stack0xffffffffffffffd8);
  return text_local._7_1_;
}

Assistant:

bool write_if_different(const char * text, const char * filename)
	{
		FileHandle existing_file(filename, "rt");
		
		bool is_equal = false;
		
		if (existing_file != nullptr)
		{
			std::string existing_text;
			
			char * line = nullptr;
			size_t line_size = 0;
			
			for (;;)
			{
				const ssize_t r = getline(&line, &line_size, existing_file);
				
				if (r < 0)
					break;
				
				existing_text.append(line);
			}
			
			free(line);
			line = nullptr;
			
			if (text == existing_text)
				is_equal = true;
			
			existing_file.close();
		}
		
		if (is_equal)
		{
			return true;
		}
		else
		{
			FileHandle file(filename, "wt");
			
			if (file == nullptr)
			{
				return false;
			}
			else
			{
				fprintf(file, "%s", text);
				
				file.close();
				
				return true;
			}
		}
	}